

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcipher.cpp
# Opt level: O1

void __thiscall QSslCipher::QSslCipher(QSslCipher *this,QString *name,SslProtocol protocol)

{
  SslProtocol SVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  long lVar4;
  long lVar5;
  char cVar6;
  _Head_base<0UL,_QSslCipherPrivate_*,_false> _Var7;
  long lVar8;
  QSslCipher *other;
  long in_FS_OFFSET;
  QStringView QVar9;
  QStringView QVar10;
  QArrayDataPointer<QSslCipher> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _Var7._M_head_impl = (QSslCipherPrivate *)operator_new(0x98);
  (_Var7._M_head_impl)->isNull = true;
  ((_Var7._M_head_impl)->protocolString).d.d = 0;
  *(char16_t **)((long)&(_Var7._M_head_impl)->protocolString + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(_Var7._M_head_impl)->protocolString + 0x10) = 0;
  ((_Var7._M_head_impl)->name).d.d = 0;
  *(char16_t **)((long)&(_Var7._M_head_impl)->name + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(_Var7._M_head_impl)->name + 0x10) = 0;
  (_Var7._M_head_impl)->supportedBits = 0;
  (_Var7._M_head_impl)->bits = 0;
  ((_Var7._M_head_impl)->keyExchangeMethod).d.d = 0;
  *(char16_t **)((long)&(_Var7._M_head_impl)->keyExchangeMethod + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(_Var7._M_head_impl)->keyExchangeMethod + 0x10) = 0;
  ((_Var7._M_head_impl)->authenticationMethod).d.d = 0;
  *(char16_t **)((long)&(_Var7._M_head_impl)->authenticationMethod + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(_Var7._M_head_impl)->authenticationMethod + 0x10) = 0;
  ((_Var7._M_head_impl)->encryptionMethod).d.d = 0;
  *(char16_t **)((long)&(_Var7._M_head_impl)->encryptionMethod + 8) = (char16_t *)0x0;
  *(undefined8 *)((long)&(_Var7._M_head_impl)->encryptionMethod + 9) = 0;
  *(undefined8 *)((long)&(_Var7._M_head_impl)->encryptionMethod + 0x11) = 0;
  (_Var7._M_head_impl)->protocol = UnknownProtocol;
  (this->d)._M_t.super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>.
  _M_t.super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
  super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl = _Var7._M_head_impl;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QSslCipher *)&DAT_aaaaaaaaaaaaaaaa;
  QSslConfiguration::supportedCiphers();
  if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
    lVar8 = local_58.size << 3;
    other = local_58.ptr;
    do {
      _Var7._M_head_impl =
           (other->d)._M_t.
           super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
           super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
      pQVar2 = *(QArrayData **)&((_Var7._M_head_impl)->name).d;
      pcVar3 = *(char16_t **)((long)&(_Var7._M_head_impl)->name + 8);
      lVar4 = *(qsizetype *)((long)&(_Var7._M_head_impl)->name + 0x10);
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      lVar5 = (name->d).size;
      if ((lVar4 == lVar5) &&
         (QVar9.m_data = pcVar3, QVar9.m_size = lVar4, QVar10.m_data = (name->d).ptr,
         QVar10.m_size = lVar5, cVar6 = QtPrivate::equalStrings(QVar9,QVar10), cVar6 != '\0')) {
        SVar1 = ((other->d)._M_t.
                 super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>
                 .super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl)->protocol;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar2,2,0x10);
          }
        }
        if (SVar1 == protocol) {
          operator=(this,other);
          break;
        }
      }
      else if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      other = other + 1;
      lVar8 = lVar8 + -8;
    } while (lVar8 != 0);
  }
  QArrayDataPointer<QSslCipher>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QSslCipher::QSslCipher(const QString &name, QSsl::SslProtocol protocol)
    : d(new QSslCipherPrivate)
{
    const auto ciphers = QSslConfiguration::supportedCiphers();
    for (const QSslCipher &cipher : ciphers) {
        if (cipher.name() == name && cipher.protocol() == protocol) {
            *this = cipher;
            return;
        }
    }
}